

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ElementsAreArrayForward_Test::
iu_SyntaxTest_x_iutest_x_ElementsAreArrayForward_Test
          (iu_SyntaxTest_x_iutest_x_ElementsAreArrayForward_Test *this)

{
  iu_SyntaxTest_x_iutest_x_ElementsAreArrayForward_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_ElementsAreArrayForward_Test_00627ea8;
  return;
}

Assistant:

IUTEST(SyntaxTest, ElementsAreArrayForward)
{
    ::std::vector<int> v;
    v.push_back(0);
    v.push_back(1);
    v.push_back(2);
    int a[3] = { 0, 1, 2 };
    int b[4] = { 0, 1, 2, 3 };

    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArrayForward(a));
    IUTEST_EXPECT_THAT(v, ::iutest::ElementsAreArrayForward(a));
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArrayForward(v));
    IUTEST_EXPECT_THAT(v, ::iutest::ElementsAreArrayForward(v));
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArrayForward(b, 1));
#if IUTEST_HAS_INITIALIZER_LIST
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArrayForward({0, 1, 2}));
#endif
}